

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

void __thiscall duckdb::MiniZStreamWrapper::FlushStream(MiniZStreamWrapper *this)

{
  unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
  *this_00;
  CompressedFile *pCVar1;
  idx_t iVar2;
  uint uVar3;
  int iVar4;
  pointer pmVar5;
  pointer pFVar6;
  _Head_base<0UL,_unsigned_char_*,_false> _Var7;
  InternalException *this_01;
  _Head_base<0UL,_unsigned_char_*,_false> _Var8;
  allocator local_59;
  MiniZStreamWrapper *local_58;
  string local_50;
  
  pCVar1 = this->file;
  this_00 = &this->mz_stream_ptr;
  local_58 = this;
  pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(this_00);
  pmVar5->next_in = (uchar *)0x0;
  pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(this_00);
  pmVar5->avail_in = 0;
  _Var7._M_head_impl =
       (pCVar1->stream_data).out_buff.
       super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  _Var8._M_head_impl = (pCVar1->stream_data).out_buff_start;
  do {
    iVar2 = (pCVar1->stream_data).out_buf_size;
    pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    pmVar5->next_out = _Var8._M_head_impl;
    uVar3 = NumericCastImpl<unsigned_int,_long,_false>::Convert
                      ((long)(_Var7._M_head_impl + (iVar2 - (long)_Var8._M_head_impl)));
    pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    pmVar5->avail_out = uVar3;
    iVar4 = duckdb_miniz::mz_deflate
                      ((this_00->
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,4);
    pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    _Var8._M_head_impl =
         (pCVar1->stream_data).out_buff_start +
         ((long)(_Var7._M_head_impl + (iVar2 - (long)_Var8._M_head_impl)) - (ulong)pmVar5->avail_out
         );
    (pCVar1->stream_data).out_buff_start = _Var8._M_head_impl;
    _Var7._M_head_impl =
         (pCVar1->stream_data).out_buff.
         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (_Var7._M_head_impl < _Var8._M_head_impl) {
      pFVar6 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&local_58->file->child_handle);
      _Var7._M_head_impl =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (*pFVar6->file_system->_vptr_FileSystem[6])
                (pFVar6->file_system,pFVar6,_Var7._M_head_impl,
                 (long)(pCVar1->stream_data).out_buff_start - (long)_Var7._M_head_impl);
      _Var7._M_head_impl =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (pCVar1->stream_data).out_buff_start = _Var7._M_head_impl;
      _Var8._M_head_impl = _Var7._M_head_impl;
    }
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_50,"Failed to compress GZIP block",&local_59);
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MiniZStreamWrapper::FlushStream() const {
	auto &sd = file->stream_data;
	mz_stream_ptr->next_in = nullptr;
	mz_stream_ptr->avail_in = 0;
	while (true) {
		auto output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;
		mz_stream_ptr->next_out = sd.out_buff_start;
		mz_stream_ptr->avail_out = NumericCast<unsigned int>(output_remaining);

		auto res = mz_deflate(mz_stream_ptr.get(), duckdb_miniz::MZ_FINISH);
		sd.out_buff_start += (output_remaining - mz_stream_ptr->avail_out);
		if (sd.out_buff_start > sd.out_buff.get()) {
			file->child_handle->Write(sd.out_buff.get(),
			                          UnsafeNumericCast<idx_t>(sd.out_buff_start - sd.out_buff.get()));
			sd.out_buff_start = sd.out_buff.get();
		}
		if (res == duckdb_miniz::MZ_STREAM_END) {
			break;
		}
		if (res != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to compress GZIP block");
		}
	}
}